

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::modifyInstruction(Analyser *this,int32_t index,Instruction *ins)

{
  Instruction i;
  Error *this_00;
  reference this_01;
  reference this_02;
  allocator<char> local_41;
  string local_40;
  Instruction *local_20;
  Instruction *ins_local;
  Analyser *pAStack_10;
  int32_t index_local;
  Analyser *this_local;
  
  local_20 = ins;
  ins_local._4_4_ = index;
  pAStack_10 = this;
  if (this->_currentFunction == -1) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"can not call MI in start code",&local_41);
    Error::Error(this_00,&local_40,(long)this->_currentLine);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  i = *ins;
  this_01 = std::
            vector<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
            ::operator[](&this->_instructions,(long)this->_currentFunction);
  this_02 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                      (this_01,(long)ins_local._4_4_);
  Instruction::operator=(this_02,i);
  return;
}

Assistant:

void Analyser::modifyInstruction(const std::int32_t index, const Instruction& ins)
{
	if (_currentFunction == -1) {
		throw Error("can not call MI in start code", _currentLine);
	}
	_instructions[_currentFunction][index] = ins;
}